

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

result<sockpp::none> * __thiscall
sockpp::socket::get_option
          (result<sockpp::none> *__return_storage_ptr__,socket *this,int level,int optname,
          void *optval,socklen_t *optlen)

{
  int iVar1;
  int *piVar2;
  error_category *peVar3;
  int iVar4;
  
  iVar1 = getsockopt(this->handle_,level,optname,optval,optlen);
  iVar4 = 0;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar4 = *piVar2;
  }
  peVar3 = (error_category *)std::_V2::system_category();
  (__return_storage_ptr__->err_)._M_value = iVar4;
  (__return_storage_ptr__->err_)._M_cat = peVar3;
  return __return_storage_ptr__;
}

Assistant:

result<> socket::get_option(
    int level, int optname, void* optval, socklen_t* optlen
) const noexcept {
    result<int> res;
#if defined(_WIN32)
    if (optval && optlen) {
        int len = static_cast<int>(*optlen);
        res = check_res(
            ::getsockopt(handle_, level, optname, static_cast<char*>(optval), &len)
        );
        if (res) {
            *optlen = static_cast<socklen_t>(len);
        }
    }
#else
    res = check_res(::getsockopt(handle_, level, optname, optval, optlen));
#endif
    return (res) ? error_code{} : res.error();
}